

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmInfo.cpp
# Opt level: O1

void __thiscall
GmmLib::GmmMultiAdapterContext::RemoveAdapterNode
          (GmmMultiAdapterContext *this,GMM_ADAPTER_INFO *pNode)

{
  GMM_ADAPTER_INFO *pGVar1;
  GMM_ADAPTER_INFO *pGVar2;
  
  pGVar1 = this->pHeadNode;
  if (pGVar1 == (GMM_ADAPTER_INFO *)0x0) {
    return;
  }
  if (pGVar1 == pNode) {
    pGVar2 = (GMM_ADAPTER_INFO *)0x0;
  }
  else {
    do {
      pGVar2 = pGVar1;
      pGVar1 = pGVar2->pNext;
      if (pGVar1 == (_GMM_ADAPTER_INFO_ *)0x0) {
        return;
      }
    } while (pGVar1 != pNode);
  }
  if (pGVar2 == (GMM_ADAPTER_INFO *)0x0) {
    if (this->pHeadNode == pNode) {
      this->pHeadNode = pNode->pNext;
    }
  }
  else {
    pGVar2->pNext = pNode->pNext;
  }
  this->NumAdapters = this->NumAdapters - 1;
  free(pNode);
  return;
}

Assistant:

void GmmLib::GmmMultiAdapterContext::RemoveAdapterNode(GMM_ADAPTER_INFO *pNode)
{
    GMM_ADAPTER_INFO *pCur = NULL, *pPrev = NULL;

    // Find the node and remove the node from the list
    pCur = this->pHeadNode;
    while (pCur)
    {
        if (pCur == pNode)
        {
            if (pPrev)
            {
                // the node to be removed is in the middle of the list or the tail
                pPrev->pNext = pNode->pNext;
            }
            else if (pNode == this->pHeadNode)
            {
                // the node to be removed is the head of the list
                this->pHeadNode = pNode->pNext;
            }

            // Decrement the Adapter Node count tracker variable
            this->NumAdapters--;

            // Free the node that was removed from the list above.
            free(pNode);
            break;
        }
        pPrev = pCur;
        pCur  = pCur->pNext;
    }
    GMM_ASSERTDPF(pCur != NULL, "CRITICAL ERROR: Node to be released does not exist in list");
}